

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::bronKerboschRecurse
          (HighsCliqueTable *this,BronKerboschData *data,HighsInt Plen,CliqueVar *X,HighsInt Xlen)

{
  anon_class_8_1_898a9ca8 comp;
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  reference pvVar4;
  reference piVar5;
  long in_RCX;
  int in_EDX;
  HighsCliqueTable *in_RSI;
  CliqueVar *in_RDI;
  int in_R8D;
  double dVar6;
  _Base_ptr p_Var7;
  HighsInt i_4;
  HighsInt vpos;
  double wv;
  HighsInt newXlen;
  HighsInt newPlen;
  CliqueVar v;
  iterator __end1_1;
  iterator __begin1_1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1_1;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> localX;
  HighsInt i_3;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt k;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> PminusNu;
  HighsInt i_2;
  HighsInt i_1;
  CliqueVar pivot;
  double pivweight;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  HighsInt i;
  double w;
  reference in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  HighsCliqueTable *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  HighsInt in_stack_fffffffffffffe34;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffe40;
  HighsCliqueTable *in_stack_fffffffffffffe48;
  CliqueVar *in_stack_fffffffffffffe50;
  CliqueVar v_00;
  CliqueVar *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  const_iterator in_stack_fffffffffffffe68;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int iVar8;
  int iVar9;
  undefined4 in_stack_fffffffffffffec4;
  HighsCliqueTable *in_stack_fffffffffffffec8;
  CliqueVar *pCVar10;
  CliqueVar in_stack_fffffffffffffed4;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_110;
  undefined1 *local_108;
  CliqueVar *local_100;
  CliqueVar *local_f8;
  CliqueVar local_e8 [8];
  CliqueVar *local_c8;
  CliqueVar *local_c0;
  int local_b4;
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  u64 *local_a0;
  int local_98;
  value_type local_94;
  undefined1 local_90 [28];
  int local_74;
  int local_70;
  value_type local_6c;
  double local_68;
  int local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  p_Var7 = (in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (local_34 = 0; local_34 != in_EDX; local_34 = local_34 + 1) {
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               &(in_RSI->cliqueentries).
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish,(long)local_34);
    dVar6 = CliqueVar::weight((CliqueVar *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe28);
    p_Var7 = (_Base_ptr)(dVar6 + (double)p_Var7);
  }
  if ((double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left -
      (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right <=
      (double)p_Var7) {
    if ((in_EDX == 0) && (in_R8D == 0)) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
                (in_stack_fffffffffffffe70,
                 (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)in_stack_fffffffffffffe68._M_current);
      if ((double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left <
          (double)p_Var7 -
          (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
        sVar3 = std::
                vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                ::size((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                        *)&(in_RSI->sizeTwoCliques).metadata);
        *(int *)&(in_RSI->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start =
             *(int *)&(in_RSI->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start - (int)sVar3;
        std::
        vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
        ::clear((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                 *)0x531018);
        (in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var7;
      }
      std::
      vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
      ::
      emplace_back<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
                ((vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 &in_stack_fffffffffffffe28->cliqueentries);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    }
    else {
      *(int *)&(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (int)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      bVar1 = BronKerboschData::stop
                        ((BronKerboschData *)
                         CONCAT17(in_stack_fffffffffffffe27,
                                  CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
      if (!bVar1) {
        local_68 = -1.0;
        CliqueVar::CliqueVar(&local_6c,0,0);
        for (local_70 = 0; local_70 != in_R8D; local_70 = local_70 + 1) {
          dVar6 = CliqueVar::weight((CliqueVar *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                    (vector<double,_std::allocator<double>_> *)
                                    in_stack_fffffffffffffe28);
          if (local_68 < dVar6) {
            local_68 = CliqueVar::weight((CliqueVar *)
                                         CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30),
                                         (vector<double,_std::allocator<double>_> *)
                                         in_stack_fffffffffffffe28);
            local_6c = *(value_type *)(in_RCX + (long)local_70 * 4);
            if (1.0 - (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right <= local_68) break;
          }
        }
        if (local_68 <
            1.0 - (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           ) {
          for (local_74 = 0; local_74 != in_EDX; local_74 = local_74 + 1) {
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)&(in_RSI->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)local_74);
            dVar6 = CliqueVar::weight((CliqueVar *)
                                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                      (vector<double,_std::allocator<double>_> *)
                                      in_stack_fffffffffffffe28);
            if (local_68 < dVar6) {
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)&(in_RSI->cliqueentries).
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(long)local_74);
              local_68 = CliqueVar::weight((CliqueVar *)
                                           CONCAT44(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30),
                                           (vector<double,_std::allocator<double>_> *)
                                           in_stack_fffffffffffffe28);
              pvVar4 = std::
                       vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ::operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     *)&(in_RSI->cliqueentries).
                                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,(long)local_74);
              local_6c = *pvVar4;
              if (1.0 - (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_right <= local_68) break;
            }
          }
        }
        HVar2 = (HighsInt)((ulong)local_90 >> 0x20);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x5312e9);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        reserve((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        local_94 = local_6c;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)0x531344);
        queryNeighbourhood(in_stack_fffffffffffffec8,
                           (vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffed4,in_RDI,HVar2);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (value_type_conflict2 *)in_stack_fffffffffffffe28);
        local_98 = 0;
        local_a0 = &(in_RSI->sizeTwoCliques).numElements;
        local_a8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe18);
        local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe18)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffe27,
                                              CONCAT16(in_stack_fffffffffffffe26,
                                                       in_stack_fffffffffffffe20)),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe18), bVar1) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          local_b4 = *piVar5;
          while (local_98 < local_b4) {
            sVar3 = (size_type)local_98;
            local_98 = local_98 + 1;
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)&(in_RSI->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish,sVar3);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                      (value_type *)in_stack_fffffffffffffe28);
          }
          local_98 = local_98 + 1;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_a8);
        }
        local_c0 = (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffe18);
        local_c8 = (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffe18);
        comp.data._4_4_ = in_stack_fffffffffffffe34;
        comp.data._0_4_ = in_stack_fffffffffffffe30;
        pdqsort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,comp);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x5314fe);
        local_f8 = (CliqueVar *)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::end((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffe18);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe27,
                               CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffe18);
        local_100 = (CliqueVar *)
                    std::
                    vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    ::insert<HighsCliqueTable::CliqueVar_const*,void>
                              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               in_stack_fffffffffffffe68,in_stack_fffffffffffffe58,
                               in_stack_fffffffffffffe50);
        local_108 = local_90;
        local_110._M_current =
             (CliqueVar *)
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::begin((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffe18);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)in_stack_fffffffffffffe18);
        while( true ) {
          v_00 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe27,
                                         CONCAT16(in_stack_fffffffffffffe26,
                                                  in_stack_fffffffffffffe20)),
                             (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                              *)in_stack_fffffffffffffe18);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_110);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x53160b);
          HVar2 = partitionNeighbourhood
                            (in_stack_fffffffffffffe48,
                             (vector<int,_std::allocator<int>_> *)
                             in_stack_fffffffffffffe40._M_current,
                             (int64_t *)in_stack_fffffffffffffe38._M_current,v_00,
                             (CliqueVar *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             (HighsInt)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          in_stack_fffffffffffffe48 = (HighsCliqueTable *)&(in_RSI->sizeTwoCliques).numElements;
          in_stack_fffffffffffffe50 =
               (CliqueVar *)
               &(in_RSI->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          in_stack_fffffffffffffe40._M_current = local_e8;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x531684);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               in_stack_fffffffffffffe40._M_current);
          partitionNeighbourhood
                    (in_stack_fffffffffffffe48,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40._M_current,
                     (int64_t *)in_stack_fffffffffffffe38._M_current,
                     SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0),
                     (CliqueVar *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (HighsInt)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                    (value_type *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe38._M_current =
               (CliqueVar *)
               CliqueVar::weight((CliqueVar *)
                                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe28 = in_RSI;
          (in_stack_fffffffffffffe28->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_parent = (_Base_ptr)
                      ((double)(in_stack_fffffffffffffe28->freespaces)._M_t._M_impl.
                               super__Rb_tree_header._M_header._M_parent +
                      (double)in_stack_fffffffffffffe38._M_current);
          in_stack_fffffffffffffe34 = HVar2;
          pCVar10 = in_stack_fffffffffffffe38._M_current;
          in_RSI = in_stack_fffffffffffffe28;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x53175e);
          bronKerboschRecurse(in_RSI,(BronKerboschData *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                              (HighsInt)((ulong)in_RCX >> 0x20),
                              (CliqueVar *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                              (HighsInt)((ulong)p_Var7 >> 0x20));
          in_stack_fffffffffffffe27 =
               BronKerboschData::stop
                         ((BronKerboschData *)
                          CONCAT17(in_stack_fffffffffffffe27,
                                   CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
          if ((bool)in_stack_fffffffffffffe27) break;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          pop_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)0x5317e5);
          (in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
               - (double)pCVar10);
          p_Var7 = (_Base_ptr)((double)p_Var7 - (double)pCVar10);
          if ((double)p_Var7 <
              (double)(in_RSI->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
          break;
          iVar8 = -1;
          for (; iVar9 = iVar8, HVar2 != in_EDX; HVar2 = HVar2 + 1) {
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)&(in_RSI->cliqueentries).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(long)HVar2);
            in_stack_fffffffffffffe26 =
                 CliqueVar::operator==
                           ((CliqueVar *)
                            CONCAT17(in_stack_fffffffffffffe27,
                                     CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                            in_stack_fffffffffffffe18);
            iVar9 = HVar2;
            if ((bool)in_stack_fffffffffffffe26) break;
          }
          in_EDX = in_EDX + -1;
          in_stack_fffffffffffffe18 =
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)&(in_RSI->cliqueentries).
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(long)iVar9);
          pvVar4 = std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 *)&(in_RSI->cliqueentries).
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,(long)in_EDX);
          std::swap<HighsCliqueTable::CliqueVar>(in_stack_fffffffffffffe18,pvVar4);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          push_back((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                    (value_type *)in_stack_fffffffffffffe28);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_110);
        }
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      }
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::bronKerboschRecurse(BronKerboschData& data,
                                           HighsInt Plen, const CliqueVar* X,
                                           HighsInt Xlen) const {
  double w = data.wR;

  for (HighsInt i = 0; i != Plen; ++i) w += data.P[i].weight(data.sol);

  if (w < data.minW - data.feastol) return;

  if (Plen == 0 && Xlen == 0) {
    std::vector<CliqueVar> clique = data.R;

    if (data.minW < w - data.feastol) {
      data.maxcliques -= data.cliques.size();
      data.cliques.clear();
      data.minW = w;
    }
    data.cliques.emplace_back(std::move(clique));
    // do not further search for cliques that are violated less than this
    // current clique
    return;
  }

  ++data.ncalls;

  if (data.stop()) return;

  double pivweight = -1.0;
  CliqueVar pivot{0, 0};

  for (HighsInt i = 0; i != Xlen; ++i) {
    if (X[i].weight(data.sol) > pivweight) {
      pivweight = X[i].weight(data.sol);
      pivot = X[i];
      if (pivweight >= 1.0 - data.feastol) break;
    }
  }

  if (pivweight < 1.0 - data.feastol) {
    for (HighsInt i = 0; i != Plen; ++i) {
      if (data.P[i].weight(data.sol) > pivweight) {
        pivweight = data.P[i].weight(data.sol);
        pivot = data.P[i];
        if (pivweight >= 1.0 - data.feastol) break;
      }
    }
  }

  std::vector<CliqueVar> PminusNu;
  PminusNu.reserve(Plen);
  queryNeighbourhood(data.neighbourhoodInds, data.numNeighbourhoodQueries,
                     pivot, data.P.data(), Plen);
  data.neighbourhoodInds.push_back(Plen);
  HighsInt k = 0;
  for (HighsInt i : data.neighbourhoodInds) {
    while (k < i) PminusNu.push_back(data.P[k++]);
    ++k;
  }

  pdqsort(PminusNu.begin(), PminusNu.end(), [&](CliqueVar a, CliqueVar b) {
    return std::make_pair(a.weight(data.sol), a.index()) >
           std::make_pair(b.weight(data.sol), b.index());
  });

  std::vector<CliqueVar> localX;
  localX.insert(localX.end(), X, X + Xlen);

  for (CliqueVar v : PminusNu) {
    HighsInt newPlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              data.P.data(), Plen);
    HighsInt newXlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              localX.data(), localX.size());

    // add v to R, update the weight, and do the recursive call
    data.R.push_back(v);
    double wv = v.weight(data.sol);
    data.wR += wv;
    bronKerboschRecurse(data, newPlen, localX.data(), newXlen);
    if (data.stop()) return;

    // remove v from R restore the weight and continue the loop in this call
    data.R.pop_back();
    data.wR -= wv;

    w -= wv;
    if (w < data.minW) return;
    // find the position of v in the vertices removed from P for the recursive
    // call
    // and also remove it from the set P for this call
    HighsInt vpos = -1;
    for (HighsInt i = newPlen; i != Plen; ++i) {
      if (data.P[i] == v) {
        vpos = i;
        break;
      }
    }

    // do the removal by first swapping it to the end of P and reduce the size
    // of P accordingly
    assert(vpos != -1);

    --Plen;
    std::swap(data.P[vpos], data.P[Plen]);

    localX.push_back(v);
  }
}